

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O1

double __thiscall iDynTree::Rotation::log(Rotation *this,double __x)

{
  AngleAxisd aa;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  local_48 [16];
  AngleAxis<double> local_38;
  
  Eigen::AngleAxis<double>::operator=(&local_38,local_48);
  (this->super_Matrix3x3).m_data[0] =
       local_38.m_angle *
       local_38.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[0];
  (this->super_Matrix3x3).m_data[1] =
       local_38.m_angle *
       local_38.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[1];
  (this->super_Matrix3x3).m_data[2] =
       local_38.m_angle *
       local_38.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[2];
  return local_38.m_angle *
         local_38.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
}

Assistant:

AngularMotionVector3 Rotation::log() const
    {
        AngularMotionVector3 ret;

        Eigen::AngleAxisd aa(Eigen::Map<const Matrix3dRowMajor>(this->data()));

        // Implementation inspired from DART, see
        // https://github.com/dartsim/dart/pull/407/files
        // https://github.com/dartsim/dart/pull/334
        // https://github.com/dartsim/dart/issues/88
        Eigen::Map<Eigen::Vector3d>(ret.data()) = aa.angle()*aa.axis();

        return ret;
    }